

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void SetCameraMode(Camera camera,int mode)

{
  float fVar1;
  float __y;
  float __x;
  float dz;
  float dy;
  float dx;
  Vector3 v2;
  Vector3 v1;
  int mode_local;
  
  dy = camera.target.x;
  v2.y = camera.position.x;
  fVar1 = dy - v2.y;
  dx = camera.target.y;
  v2.z = camera.position.y;
  __y = dx - v2.z;
  __x = camera.target.z - camera.position.z;
  CAMERA.targetDistance = sqrtf(__x * __x + fVar1 * fVar1 + __y * __y);
  CAMERA.angle.x = atan2f(fVar1,__x);
  fVar1 = sqrtf(fVar1 * fVar1 + __x * __x);
  CAMERA.angle.y = atan2f(__y,fVar1);
  CAMERA.playerEyesPosition = v2.z;
  if ((mode == 3) || (mode == 4)) {
    DisableCursor();
  }
  else {
    EnableCursor();
  }
  CAMERA.mode = mode;
  return;
}

Assistant:

void SetCameraMode(Camera camera, int mode)
{
    Vector3 v1 = camera.position;
    Vector3 v2 = camera.target;

    float dx = v2.x - v1.x;
    float dy = v2.y - v1.y;
    float dz = v2.z - v1.z;

    CAMERA.targetDistance = sqrtf(dx*dx + dy*dy + dz*dz);   // Distance to target

    // Camera angle calculation
    CAMERA.angle.x = atan2f(dx, dz);                        // Camera angle in plane XZ (0 aligned with Z, move positive CCW)
    CAMERA.angle.y = atan2f(dy, sqrtf(dx*dx + dz*dz));      // Camera angle in plane XY (0 aligned with X, move positive CW)

    CAMERA.playerEyesPosition = camera.position.y;          // Init player eyes position to camera Y position

    // Lock cursor for first person and third person cameras
    if ((mode == CAMERA_FIRST_PERSON) || (mode == CAMERA_THIRD_PERSON)) DisableCursor();
    else EnableCursor();

    CAMERA.mode = mode;
}